

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

bool __thiscall Json::Value::isUInt(Value *this)

{
  char cVar1;
  bool bVar2;
  double dVar3;
  double integral_part;
  double dStack_8;
  
  cVar1 = this->field_0x8;
  if (cVar1 == '\x03') {
    dVar3 = (this->value_).real_;
    bVar2 = false;
    if ((0.0 <= dVar3) && (dVar3 <= 4294967295.0)) {
      dStack_8 = 0.0;
      dVar3 = modf(dVar3,&dStack_8);
      return (bool)(-(dVar3 == 0.0) & 1);
    }
  }
  else {
    if ((cVar1 != '\x02') && (cVar1 != '\x01')) {
      return false;
    }
    bVar2 = *(int *)((long)&this->value_ + 4) == 0;
  }
  return bVar2;
}

Assistant:

bool Value::isUInt() const {
  switch (type_) {
  case intValue:
#if defined(JSON_HAS_INT64)
    return value_.int_ >= 0 && LargestUInt(value_.int_) <= LargestUInt(maxUInt);
#else
    return value_.int_ >= 0;
#endif
  case uintValue:
#if defined(JSON_HAS_INT64)
    return value_.uint_ <= maxUInt;
#else
    return true;
#endif
  case realValue:
    return value_.real_ >= 0 && value_.real_ <= maxUInt &&
           IsIntegral(value_.real_);
  default:
    break;
  }
  return false;
}